

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GridDataType0::SetDataValues(GridDataType0 *this,KUINT8 *Data,KUINT16 NumBytes)

{
  pointer puVar1;
  KUINT16 i;
  ulong uVar2;
  
  puVar1 = (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar1;
  }
  *(KUINT16 *)&(this->super_GridData).field_0xc = NumBytes;
  for (uVar2 = 0; uVar2 < NumBytes; uVar2 = uVar2 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vui8DataVals,Data + uVar2);
    NumBytes = *(KUINT16 *)&(this->super_GridData).field_0xc;
  }
  return;
}

Assistant:

void GridDataType0::SetDataValues( KUINT8 * Data, KUINT16 NumBytes )
{
    m_vui8DataVals.clear();
    m_ui16NumBytes = NumBytes;
    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        m_vui8DataVals.push_back( Data[i] );
    }
}